

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

string * __thiscall
PacketReader::GetFixedString_abi_cxx11_
          (string *__return_storage_ptr__,PacketReader *this,size_t length)

{
  size_t sVar1;
  long lVar2;
  allocator<char> local_21;
  ulong local_20;
  size_t length_local;
  PacketReader *this_local;
  string *ret;
  
  local_20 = length;
  length_local = (size_t)this;
  this_local = (PacketReader *)__return_storage_ptr__;
  sVar1 = Remaining(this);
  if (sVar1 < local_20) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
    lVar2 = std::__cxx11::string::length();
    this->pos = lVar2 + this->pos;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PacketReader::GetFixedString(std::size_t length)
{
	if (this->Remaining() < length)
		return "";

	std::string ret = this->data.substr(this->pos, length);
	this->pos += ret.length();

	return ret;
}